

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroBranch
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  uint uVar1;
  uint uVar2;
  undefined4 in_register_0000000c;
  MipsImmediateData *immediates_00;
  char *pcVar3;
  uint in_R8D;
  long lVar4;
  initializer_list<AssemblyTemplateArgument> variables;
  allocator<char> local_192;
  allocator<char> local_191;
  __uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> local_190;
  string op;
  string macroText;
  char *local_148;
  string local_140 [32];
  char *local_120;
  string local_118 [32];
  char *local_f8;
  string local_f0 [32];
  char *local_d0;
  string local_c8 [32];
  char *local_a8;
  string local_a0 [32];
  char *local_80;
  string local_78;
  char *local_58;
  string local_50;
  
  immediates_00 = (MipsImmediateData *)CONCAT44(in_register_0000000c,flags);
  uVar1 = in_R8D & 7;
  op._M_dataplus._M_p = (pointer)&op.field_2;
  op._M_string_length = 0;
  op.field_2._M_local_buf[0] = '\0';
  if ((uVar1 == 6) || (uVar1 == 1)) {
    std::__cxx11::string::assign((char *)&op);
    pcVar3 = 
    "\n\t\t\t.if %imm% == 0\n\t\t\t\t%op%\t%rs%,r0,%dest%\n\t\t\t.else\n\t\t\t\tli\t\tr1,%imm%\n\t\t\t\t%op%\t%rs%,r1,%dest%\n\t\t\t.endif\n\t\t"
    ;
  }
  else {
    uVar2 = in_R8D & 6;
    if (((in_R8D >> 9 & 1) == 0) || ((uVar2 - 2 & 0xfffffffd) != 0)) {
      if ((uVar2 != 4) && (uVar2 != 2)) {
        (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        goto LAB_001710a9;
      }
      std::__cxx11::string::assign((char *)&op);
      pcVar3 = 
      "\n\t\t\t.if %revcmp%\n\t\t\t\tslt%u%\tr1,%rt%,%rs%\n\t\t\t.else\n\t\t\t\tslt%u%\tr1,%rs%,%rt%\n\t\t\t.endif\n\t\t\t%op%\tr1,%dest%\n\t\t"
      ;
    }
    else {
      std::__cxx11::string::assign((char *)&op);
      pcVar3 = 
      "\n\t\t\t.if %revcmp% && %imm% == 0\n\t\t\t\tslt%u% \tr1,r0,%rs%\n\t\t\t.elseif %revcmp%\n\t\t\t\tli\t\tr1,%imm%\n\t\t\t\tslt%u%\tr1,r1,%rs%\n\t\t\t.elseif (%imm% < -0x8000) || (%imm% >= 0x8000)\n\t\t\t\tli\t\tr1,%imm%\n\t\t\t\tslt%u%\tr1,%rs%,r1\n\t\t\t.else\n\t\t\t\tslti%u%\tr1,%rs%,%imm%\n\t\t\t.endif\n\t\t\t%op%\tr1,%dest%\n\t\t"
      ;
    }
  }
  preprocessMacro_abi_cxx11_(&macroText,pcVar3,immediates_00);
  local_148 = "%op%";
  local_190._M_t.
  super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
  super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl =
       (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)
       (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)parser;
  std::__cxx11::string::string(local_140,(string *)&op);
  local_120 = "%u%";
  pcVar3 = " ";
  if ((uVar1 - 3 & 0xfffffffd) == 0) {
    pcVar3 = "u";
  }
  std::__cxx11::string::string<std::allocator<char>>(local_118,pcVar3,&local_191);
  local_f8 = "%revcmp%";
  pcVar3 = "1";
  if ((in_R8D >> 0x13 & 1) == 0) {
    pcVar3 = "0";
  }
  std::__cxx11::string::string<std::allocator<char>>(local_f0,pcVar3,&local_192);
  local_d0 = "%rs%";
  std::__cxx11::string::string(local_c8,(string *)&(immediates->primary).expression);
  local_a8 = "%rt%";
  std::__cxx11::string::string
            (local_a0,(string *)
                      &(immediates->secondary).expression.expression.
                       super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  local_80 = "%imm%";
  Expression::toString_abi_cxx11_(&local_78,&(immediates_00->primary).expression);
  local_58 = "%dest%";
  Expression::toString_abi_cxx11_(&local_50,&(immediates_00->secondary).expression);
  parser = (Parser *)
           local_190._M_t.
           super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
           super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  variables._M_array = (iterator)(ulong)in_R8D;
  variables._M_len = (size_type)&local_148;
  createMacro((Parser *)
              local_190._M_t.
              super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
              super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl,(string *)registers,
              (int)&macroText,variables);
  lVar4 = 0xf8;
  do {
    std::__cxx11::string::~string(local_140 + lVar4 + -8);
    lVar4 = lVar4 + -0x28;
  } while (lVar4 != -0x20);
  std::__cxx11::string::~string((string *)&macroText);
LAB_001710a9:
  std::__cxx11::string::~string((string *)&op);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroBranch(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* selectedTemplate;

	int type = flags & MIPSM_CONDITIONMASK;

	bool bne = type == MIPSM_NE;
	bool beq = type == MIPSM_EQ;
	bool beqz = type == MIPSM_GE || type == MIPSM_GEU;
	bool bnez = type == MIPSM_LT || type == MIPSM_LTU;
	bool unsigned_ = type == MIPSM_GEU || type == MIPSM_LTU;
	bool immediate = (flags & MIPSM_IMM) != 0;
	bool likely = (flags & MIPSM_LIKELY) != 0;
	bool revcmp = (flags & MIPSM_REVCMP) != 0;

	std::string op;
	if (bne || beq)
	{
		const char* templateNeEq = R"(
			.if %imm% == 0
				%op%	%rs%,r0,%dest%
			.else
				li		r1,%imm%
				%op%	%rs%,r1,%dest%
			.endif
		)";

		selectedTemplate = templateNeEq;
		if(likely)
			op = bne ? "bnel" : "beql";
		else
			op = bne ? "bne" : "beq";
	} else if (immediate && (beqz || bnez))
	{
		const char* templateImmediate = R"(
			.if %revcmp% && %imm% == 0
				slt%u% 	r1,r0,%rs%
			.elseif %revcmp%
				li		r1,%imm%
				slt%u%	r1,r1,%rs%
			.elseif (%imm% < -0x8000) || (%imm% >= 0x8000)
				li		r1,%imm%
				slt%u%	r1,%rs%,r1
			.else
				slti%u%	r1,%rs%,%imm%
			.endif
			%op%	r1,%dest%
		)";

		selectedTemplate = templateImmediate;
		if(likely)
			op = bnez ? "bnezl" : "beqzl";
		else
			op = bnez ? "bnez" : "beqz";
	} else if (beqz || bnez)
	{
		const char* templateRegister = R"(
			.if %revcmp%
				slt%u%	r1,%rt%,%rs%
			.else
				slt%u%	r1,%rs%,%rt%
			.endif
			%op%	r1,%dest%
		)";

		selectedTemplate = templateRegister;
		if(likely)
			op = bnez ? "bnezl" : "beqzl";
		else
			op = bnez ? "bnez" : "beqz";
	} else {
		return nullptr;
	}
	
	std::string macroText = preprocessMacro(selectedTemplate,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%op%",		op },
			{ "%u%",		unsigned_ ? "u" : " "},
			{ "%revcmp%",	revcmp ? "1" : "0"},
			{ "%rs%",		registers.grs.name.string() },
			{ "%rt%",		registers.grt.name.string() },
			{ "%imm%",		immediates.primary.expression.toString() },
			{ "%dest%",	immediates.secondary.expression.toString() },
	});
}